

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,char_const*,fmt::v8::detail::digit_grouping<char32_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,char *significand,
          int significand_size,int integral_size,char32_t decimal_point,
          digit_grouping<char32_t> *grouping)

{
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar1;
  basic_string_view<char32_t> digits;
  undefined **local_820;
  undefined1 *local_818;
  long lStack_810;
  long local_808;
  undefined1 local_800 [2008];
  
  if ((grouping->sep_).thousands_sep == L'\0') {
    bVar1 = write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t>
                      (out,significand,significand_size,integral_size,decimal_point);
    return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar1.container;
  }
  lStack_810 = 0;
  local_820 = &PTR_grow_001b2970;
  local_808 = 500;
  local_818 = local_800;
  write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t>
            ((buffer<char32_t> *)&local_820,significand,significand_size,integral_size,decimal_point
            );
  if (-1 < integral_size) {
    digits.size_._0_4_ = integral_size;
    digits.data_ = (char32_t *)local_818;
    digits.size_._4_4_ = 0;
    digit_grouping<char32_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t>
              (grouping,out,digits);
    bVar1 = copy_str_noinline<char32_t,char32_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                      ((char32_t *)(local_818 + (ulong)(uint)integral_size * 4),
                       (char32_t *)(local_818 + lStack_810 * 4),out);
    if (local_818 != local_800) {
      operator_delete(local_818,local_808 << 2);
    }
    return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar1.container;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
             ,0x195,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}